

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int secure_random_init(void)

{
  int unaff_retaddr;
  char *in_stack_00000008;
  undefined4 local_4;
  
  if (secure_random_data.initialized == 0) {
    secure_random_data.urandom = io_open(in_stack_00000008,unaff_retaddr);
    if (secure_random_data.urandom == (IOHANDLE)0x0) {
      local_4 = 1;
    }
    else {
      secure_random_data.initialized = 1;
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int secure_random_init()
{
	if(secure_random_data.initialized)
	{
		return 0;
	}
#if defined(CONF_FAMILY_WINDOWS)
	if(CryptAcquireContext(&secure_random_data.provider, NULL, NULL, PROV_RSA_FULL, CRYPT_VERIFYCONTEXT))
	{
		secure_random_data.initialized = 1;
		return 0;
	}
	else
	{
		return 1;
	}
#else
	secure_random_data.urandom = io_open("/dev/urandom", IOFLAG_READ);
	if(secure_random_data.urandom)
	{
		secure_random_data.initialized = 1;
		return 0;
	}
	else
	{
		return 1;
	}
#endif
}